

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::SkipCurrentNode_abi_cxx11_(OgreXmlSerializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  string *psVar2;
  bool bVar3;
  allocator<char> local_49;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 2) {
        iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,(char *)CONCAT44(extraout_var,iVar1),&local_49);
        if (local_40 == (this->m_currentNodeName)._M_string_length) {
          if (local_40 == 0) {
            bVar3 = true;
          }
          else {
            iVar1 = bcmp(local_48,(this->m_currentNodeName)._M_dataplus._M_p,local_40);
            bVar3 = iVar1 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (local_48 != local_38) {
          operator_delete(local_48,local_38[0] + 1);
        }
        if (bVar3) {
          psVar2 = NextNode_abi_cxx11_(this);
          return psVar2;
        }
      }
      iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_currentNodeName,0,(char *)(this->m_currentNodeName)._M_string_length,
             0x7a94f0);
  return &this->m_currentNodeName;
}

Assistant:

std::string &OgreXmlSerializer::SkipCurrentNode()
{
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG("Skipping node <" + m_currentNodeName + ">");
#endif

    for(;;) {
        if (!m_reader->read()) {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
        if ( m_reader->getNodeType() != irr::io::EXN_ELEMENT_END ) {
            continue;
        } else if ( std::string( m_reader->getNodeName() ) == m_currentNodeName ) {
            break;
        }
    }

    return NextNode();
}